

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O0

IterateResult __thiscall dit::GetUint32Case::iterate(GetUint32Case *this)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  deUint32 local_1a8 [4];
  char *local_198;
  MessageBuilder local_190;
  GetUint32Case *local_10;
  GetUint32Case *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  local_198 = tcu::TestNode::getDescription((TestNode *)this);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_190,&local_198);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [11])0x38039f);
  local_1a8[0] = (*this->m_func)();
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1a8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		m_testCtx.getLog() << TestLog::Message << getDescription() << " returned " << m_func() << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}